

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

void ERR_restore_state(ERR_SAVE_STATE *state)

{
  ERR_STATE *pEVar1;
  ulong local_20;
  size_t i;
  ERR_STATE *dst;
  ERR_SAVE_STATE *state_local;
  
  if ((state == (ERR_SAVE_STATE *)0x0) || (state->num_errors == 0)) {
    ERR_clear_error();
  }
  else {
    if (0xf < state->num_errors) {
      abort();
    }
    pEVar1 = err_get_state();
    if (pEVar1 != (ERR_STATE *)0x0) {
      for (local_20 = 0; local_20 < state->num_errors; local_20 = local_20 + 1) {
        err_copy(pEVar1->errors + local_20,state->errors + local_20);
      }
      pEVar1->top = (int)state->num_errors - 1;
      pEVar1->bottom = 0xf;
    }
  }
  return;
}

Assistant:

void ERR_restore_state(const ERR_SAVE_STATE *state) {
  if (state == NULL || state->num_errors == 0) {
    ERR_clear_error();
    return;
  }

  if (state->num_errors >= ERR_NUM_ERRORS) {
    abort();
  }

  ERR_STATE *const dst = err_get_state();
  if (dst == NULL) {
    return;
  }

  for (size_t i = 0; i < state->num_errors; i++) {
    err_copy(&dst->errors[i], &state->errors[i]);
  }
  dst->top = (unsigned)(state->num_errors - 1);
  dst->bottom = ERR_NUM_ERRORS - 1;
}